

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::rust::RustGenerator::RustGenerator
          (RustGenerator *this,Parser *parser,string *path,string *file_name)

{
  allocator<char> local_37a;
  allocator<char> local_379;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  Config local_2c8;
  Config local_178;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"",(allocator<char> *)&local_2c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"::",&local_37a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"rs",&local_379);
  BaseGenerator::BaseGenerator
            (&this->super_BaseGenerator,parser,path,file_name,&local_338,&local_358,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  (this->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_002fadc0;
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  local_378._M_string_length = 0;
  local_378.field_2._M_local_buf[0] = '\0';
  CodeWriter::CodeWriter(&this->code_,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  this->cur_name_space_ = (Namespace *)0x0;
  anon_unknown_26::RustDefaultConfig();
  WithFlagOptions(&local_178,&local_2c8,&parser->opts,path);
  (anonymous_namespace)::RustKeywords_abi_cxx11_();
  IdlNamer::IdlNamer(&this->namer_,&local_178,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_2f8);
  Namer::Config::~Config(&local_178);
  Namer::Config::~Config(&local_2c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"  ",&local_37a);
  std::__cxx11::string::_M_assign((string *)&(this->code_).pad_);
  std::__cxx11::string::~string((string *)&local_2c8);
  return;
}

Assistant:

RustGenerator(const Parser &parser, const std::string &path,
                const std::string &file_name)
      : BaseGenerator(parser, path, file_name, "", "::", "rs"),
        cur_name_space_(nullptr),
        namer_(WithFlagOptions(RustDefaultConfig(), parser.opts, path),
               RustKeywords()) {
    // TODO: Namer flag overrides should be in flatc or flatc_main.
    code_.SetPadding("  ");
  }